

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O2

void __thiscall FSingleLumpFont::LoadFON2(FSingleLumpFont *this,int lump,BYTE *data)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  int height;
  size_t __n;
  int iVar5;
  CharData *pCVar6;
  void *pvVar7;
  FFontChar2 *this_00;
  int iVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  ushort *__src;
  char *pcVar13;
  ulong uVar14;
  uint uVar15;
  int local_58;
  int local_38;
  
  this->FontType = FONT2;
  (this->super_FFont).FontHeight = (uint)*(ushort *)(data + 4);
  bVar1 = data[6];
  (this->super_FFont).FirstChar = (uint)bVar1;
  bVar2 = data[7];
  (this->super_FFont).LastChar = (uint)bVar2;
  bVar3 = data[10];
  (this->super_FFont).ActiveColors = (int)((ulong)bVar3 + 1);
  (this->super_FFont).PatchRemap = (BYTE *)0x0;
  this->RescalePalette = data[9] == '\0';
  lVar10 = (ulong)bVar2 - (ulong)bVar1;
  iVar8 = (int)lVar10;
  uVar12 = (lVar10 + 1) * 0x10;
  if (iVar8 < -1) {
    uVar12 = 0xffffffffffffffff;
  }
  uVar14 = lVar10 * 4 + 4;
  if (iVar8 < -1) {
    uVar14 = 0xffffffffffffffff;
  }
  pCVar6 = (CharData *)operator_new__(uVar12);
  (this->super_FFont).Chars = pCVar6;
  pvVar7 = operator_new__(uVar14);
  if ((data[0xb] & 1) == 0) {
    __src = (ushort *)(data + 0xc);
    iVar5 = 0;
  }
  else {
    iVar5 = (int)*(short *)(data + 0xc);
    __src = (ushort *)(data + 0xe);
  }
  (this->super_FFont).GlobalKerning = iVar5;
  local_58 = (int)(lVar10 + 1);
  if (data[8] == '\0') {
    iVar5 = 0;
    for (lVar10 = 0; lVar10 <= iVar8; lVar10 = lVar10 + 1) {
      uVar4 = *__src;
      *(uint *)((long)pvVar7 + lVar10 * 4) = (uint)uVar4;
      iVar5 = iVar5 + (uint)uVar4;
      __src = __src + 1;
    }
  }
  else {
    uVar4 = *__src;
    for (lVar10 = 0; lVar10 <= iVar8; lVar10 = lVar10 + 1) {
      *(uint *)((long)pvVar7 + lVar10 * 4) = (uint)uVar4;
    }
    iVar5 = (uint)uVar4 * local_58;
    __src = __src + 1;
  }
  if (bVar2 < 0x20 || 0x20 < bVar1) {
    if (bVar2 < 0x4e || 0x4e < bVar1) {
      iVar5 = iVar5 * 2;
      local_58 = local_58 * 3;
    }
    else {
      iVar5 = *(int *)((long)pvVar7 + (ulong)(0x4e - bVar1) * 4) + 1;
      local_58 = 2;
    }
    iVar5 = iVar5 / local_58;
  }
  else {
    iVar5 = *(int *)((long)pvVar7 + (ulong)(0x20 - bVar1) * 4);
  }
  (this->super_FFont).SpaceWidth = iVar5;
  __n = ((ulong)bVar3 + 1) * 3;
  memcpy(this->PaletteData,__src,__n);
  pcVar13 = (char *)((long)__src + __n);
  for (uVar15 = 0; (int)uVar15 <= iVar8; uVar15 = uVar15 + 1) {
    lVar10 = (long)(int)uVar15;
    iVar5 = *(int *)((long)pvVar7 + lVar10 * 4);
    height = (this->super_FFont).FontHeight;
    iVar11 = height * iVar5;
    pCVar6 = (this->super_FFont).Chars;
    pCVar6[lVar10].XMove = iVar5;
    if (iVar11 < 1) {
      pCVar6[lVar10].Pic = (FTexture *)0x0;
    }
    else {
      this_00 = (FFontChar2 *)operator_new(0x78);
      local_38 = (int)data;
      FFontChar2::FFontChar2(this_00,lump,(int)pcVar13 - local_38,iVar5,height,0,0);
      (this->super_FFont).Chars[lVar10].Pic = (FTexture *)this_00;
      do {
        uVar9 = (uint)*pcVar13;
        if (*pcVar13 < '\0') {
          iVar11 = iVar11 + uVar9 + -1;
        }
        else {
          pcVar13 = pcVar13 + uVar9;
          iVar11 = iVar11 + ~uVar9;
        }
        pcVar13 = pcVar13 + 2;
      } while (0 < iVar11);
    }
    if (iVar11 < 0) {
      uVar15 = uVar15 + (this->super_FFont).FirstChar;
      I_FatalError("Overflow decompressing char %d (%c) of %s",(ulong)uVar15,(ulong)uVar15,
                   (this->super_FFont).Name);
    }
  }
  (*(this->super_FFont)._vptr_FFont[4])();
  operator_delete__(pvVar7);
  return;
}

Assistant:

void FSingleLumpFont::LoadFON2 (int lump, const BYTE *data)
{
	int count, i, totalwidth;
	int *widths2;
	WORD *widths;
	const BYTE *palette;
	const BYTE *data_p;

	FontType = FONT2;
	FontHeight = data[4] + data[5]*256;
	FirstChar = data[6];
	LastChar = data[7];
	ActiveColors = data[10]+1;
	PatchRemap = NULL;
	RescalePalette = data[9] == 0;
	
	count = LastChar - FirstChar + 1;
	Chars = new CharData[count];
	widths2 = new int[count];
	if (data[11] & 1)
	{ // Font specifies a kerning value.
		GlobalKerning = LittleShort(*(SWORD *)&data[12]);
		widths = (WORD *)(data + 14);
	}
	else
	{ // Font does not specify a kerning value.
		GlobalKerning = 0;
		widths = (WORD *)(data + 12);
	}
	totalwidth = 0;

	if (data[8])
	{ // Font is mono-spaced.
		totalwidth = LittleShort(widths[0]);
		for (i = 0; i < count; ++i)
		{
			widths2[i] = totalwidth;
		}
		totalwidth *= count;
		palette = (BYTE *)&widths[1];
	}
	else
	{ // Font has varying character widths.
		for (i = 0; i < count; ++i)
		{
			widths2[i] = LittleShort(widths[i]);
			totalwidth += widths2[i];
		}
		palette = (BYTE *)(widths + i);
	}

	if (FirstChar <= ' ' && LastChar >= ' ')
	{
		SpaceWidth = widths2[' '-FirstChar];
	}
	else if (FirstChar <= 'N' && LastChar >= 'N')
	{
		SpaceWidth = (widths2['N' - FirstChar] + 1) / 2;
	}
	else
	{
		SpaceWidth = totalwidth * 2 / (3 * count);
	}

	memcpy(PaletteData, palette, ActiveColors*3);

	data_p = palette + ActiveColors*3;

	for (i = 0; i < count; ++i)
	{
		int destSize = widths2[i] * FontHeight;
		Chars[i].XMove = widths2[i];
		if (destSize <= 0)
		{
			Chars[i].Pic = NULL;
		}
		else
		{
			Chars[i].Pic = new FFontChar2 (lump, int(data_p - data), widths2[i], FontHeight);
			do
			{
				SBYTE code = *data_p++;
				if (code >= 0)
				{
					data_p += code+1;
					destSize -= code+1;
				}
				else if (code != -128)
				{
					data_p++;
					destSize -= (-code)+1;
				}
			} while (destSize > 0);
		}
		if (destSize < 0)
		{
			i += FirstChar;
			I_FatalError ("Overflow decompressing char %d (%c) of %s", i, i, Name);
		}
	}

	LoadTranslations();
	delete[] widths2;
}